

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void P_WriteACSDefereds(FILE *file)

{
  uint uVar1;
  level_info_t *plVar2;
  FString local_38;
  FString empty;
  uint local_1c;
  FPNGChunkArchive *pFStack_18;
  uint i;
  FPNGChunkArchive *arc;
  FILE *file_local;
  
  pFStack_18 = (FPNGChunkArchive *)0x0;
  local_1c = 0;
  while( true ) {
    uVar1 = TArray<level_info_t,_level_info_t>::Size(&wadlevelinfos);
    if (uVar1 <= local_1c) break;
    plVar2 = TArray<level_info_t,_level_info_t>::operator[](&wadlevelinfos,(ulong)local_1c);
    if (plVar2->defered != (acsdefered_t *)0x0) {
      if (pFStack_18 == (FPNGChunkArchive *)0x0) {
        pFStack_18 = (FPNGChunkArchive *)operator_new(0x300);
        FPNGChunkArchive::FPNGChunkArchive(pFStack_18,file,0x64536361);
      }
      plVar2 = TArray<level_info_t,_level_info_t>::operator[](&wadlevelinfos,(ulong)local_1c);
      writeDefereds(&pFStack_18->super_FArchive,plVar2);
    }
    local_1c = local_1c + 1;
  }
  if (pFStack_18 != (FPNGChunkArchive *)0x0) {
    FString::FString(&local_38,"");
    FArchive::operator<<(&pFStack_18->super_FArchive,&local_38);
    if (pFStack_18 != (FPNGChunkArchive *)0x0) {
      (*(pFStack_18->super_FArchive)._vptr_FArchive[1])();
    }
    FString::~FString(&local_38);
  }
  return;
}

Assistant:

void P_WriteACSDefereds (FILE *file)
{
	FPNGChunkArchive *arc = NULL;

	for (unsigned int i = 0; i < wadlevelinfos.Size(); i++)
	{
		if (wadlevelinfos[i].defered)
		{
			if (arc == NULL)
			{
				arc = new FPNGChunkArchive (file, ACSD_ID);
			}
			writeDefereds (*arc, (level_info_t *)&wadlevelinfos[i]);
		}
	}

	if (arc != NULL)
	{
		// Signal end of defereds
		FString empty = "";
		(*arc) << empty;
		delete arc;
	}
}